

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O2

void __thiscall QTemporaryDir::QTemporaryDir(QTemporaryDir *this)

{
  QTemporaryDirPrivate *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QTemporaryDirPrivate *)operator_new(0x20);
  (this_00->pathOrError).d.size = 0;
  (this_00->pathOrError).d.d = (Data *)0x0;
  (this_00->pathOrError).d.ptr = (char16_t *)0x0;
  this_00->autoRemove = true;
  this_00->success = false;
  this->d_ptr = this_00;
  defaultTemplateName();
  QTemporaryDirPrivate::create(this_00,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTemporaryDir::QTemporaryDir()
    : d_ptr(new QTemporaryDirPrivate)
{
    d_ptr->create(defaultTemplateName());
}